

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O3

void __thiscall CardProdGetView::test_method(CardProdGetView *this)

{
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  char *__function;
  VectorXd xT;
  VectorXd xSO3T;
  VectorXd xSO3;
  VectorXd x;
  Vector2d xR2;
  Vector3d xR3;
  CartesianProduct S;
  SO3<mnf::ExpMapMatrix> RotSpace;
  RealSpace R3;
  RealSpace R2;
  char *local_528;
  char *local_520;
  Scalar local_518;
  bool local_510 [16];
  shared_count sStack_500;
  Matrix<double,_3,_1,_0,_3,_1> local_4f8;
  Segment local_4e0;
  undefined1 local_4a8 [16];
  undefined1 local_498 [24];
  long lStack_480;
  undefined **local_478;
  undefined1 local_470;
  undefined8 *local_468;
  char **local_460;
  Matrix<double,_3,_1,_0,_3,_1> local_458;
  Scalar local_440;
  Scalar local_438;
  Scalar local_430;
  Matrix<double,_3,_1,_0,_3,_1> local_428;
  double *local_410;
  double local_408;
  double *local_3f8;
  double local_3f0;
  double *local_3e0;
  double local_3d8;
  double *local_3c8;
  long local_3c0;
  double *local_3b0;
  long local_3a8;
  double *local_398;
  long local_390;
  code *local_380 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_328 [24];
  void *local_310;
  void *local_2f8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  SO3<mnf::ExpMapMatrix> local_1c0;
  code *local_120 [11];
  void *local_c8;
  void *local_b8;
  code *local_a8 [11];
  void *local_50;
  void *local_40;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_a8,2);
  mnf::RealSpace::RealSpace((RealSpace *)local_120,3);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_1c0);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_380,(Manifold *)local_120,&local_1c0.super_Manifold);
  mnf::CartesianProduct::multiply((Manifold *)local_380);
  local_498._16_8_ = 0.0;
  lStack_480 = 0;
  local_498._16_8_ = Eigen::internal::conditional_aligned_new_auto<double,true>(0xe);
  local_4e0.
  super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
  .m_data = (PointerType)(local_498 + 0x10);
  lStack_480 = 0xe;
  local_4e0.
  super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
  .m_rows.m_value = 0;
  local_4e0.
  super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
  ._16_8_ = 1;
  local_4e0.
  super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
  .
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
  .m_xpr = (XprTypeNested)0x1;
  *(double *)local_498._16_8_ = 1.0;
  local_478 = (undefined **)0x4000000000000000;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4e0,
                      (Scalar *)&local_478);
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       3.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,(Scalar *)&local_428);
  local_510[0] = false;
  local_510[1] = false;
  local_510[2] = false;
  local_510[3] = false;
  local_510[4] = false;
  local_510[5] = false;
  local_510[6] = true;
  local_510[7] = true;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,(Scalar *)local_510);
  local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,(Scalar *)&local_4f8);
  local_498._0_8_ = (double *)0x4018000000000000;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,(Scalar *)local_498);
  local_4a8._0_8_ = (double *)0x401c000000000000;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,(Scalar *)local_4a8);
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       8.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,(Scalar *)&local_458);
  local_528 = (char *)0x4022000000000000;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,(Scalar *)&local_528);
  local_518 = 10.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,&local_518);
  local_430 = 11.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,&local_430);
  local_438 = 12.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,&local_438);
  local_440 = 13.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,&local_440);
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       14.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar1,local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array + 2);
  if ((&((local_4e0.
          super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
         .m_xpr)->
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ).field_0x0 +
       local_4e0.
       super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
       .
       super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
       .m_rows.m_value ==
       (undefined1 *)
       (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
        local_4e0.
        super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
        .m_data)->m_storage).m_data.array[1]) &&
     (local_4e0.
      super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
      ._16_8_ == 1)) {
    local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (double)Eigen::internal::conditional_aligned_new_auto<double,true>(8);
    local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 3.95252516672997e-323;
    local_4e0.
    super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
    .
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
    .m_rows.m_value = 0;
    local_4e0.
    super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
    .
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
    ._16_8_ = 1;
    local_4e0.
    super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
    .
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
    .m_xpr = (XprTypeNested)0x1;
    *(double *)
     local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
     [0] = 1.0;
    local_478 = (undefined **)0x4000000000000000;
    local_4e0.
    super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
    .
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
    .m_data = (PointerType)&local_4f8;
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4e0,
                        (Scalar *)&local_478);
    local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 3.0;
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar1,(Scalar *)&local_428);
    local_510[0] = false;
    local_510[1] = false;
    local_510[2] = false;
    local_510[3] = false;
    local_510[4] = false;
    local_510[5] = false;
    local_510[6] = true;
    local_510[7] = true;
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar1,(Scalar *)local_510);
    local_498._0_8_ = (double *)0x401c000000000000;
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar1,(Scalar *)local_498);
    local_4a8._0_8_ = (double *)0x4020000000000000;
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar1,(Scalar *)local_4a8);
    local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 13.0;
    pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar1,(Scalar *)&local_458);
    local_528 = (char *)0x402c000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar1,(Scalar *)&local_528);
    if ((&((local_4e0.
            super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
            .
            super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
           .m_xpr)->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).field_0x0 +
         local_4e0.
         super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
         .
         super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
         .m_rows.m_value ==
         (undefined1 *)
         (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          local_4e0.
          super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
          .m_data)->m_storage).m_data.array[1]) &&
       (local_4e0.
        super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
        ._16_8_ == 1)) {
      local_498._0_8_ = (double *)0x0;
      local_498._8_8_ = 0.0;
      local_498._0_8_ = Eigen::internal::conditional_aligned_new_auto<double,true>(9);
      local_498._8_8_ = 4.44659081257122e-323;
      local_4a8._0_8_ = (double *)0x0;
      local_4a8._8_8_ = 0.0;
      local_4a8._0_8_ = Eigen::internal::conditional_aligned_new_auto<double,true>(3);
      local_4a8._8_8_ = 1.48219693752374e-323;
      local_4e0.
      super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
      .m_rows.m_value = 0;
      local_4e0.
      super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
      ._16_8_ = 1;
      local_4e0.
      super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
      .m_xpr = (XprTypeNested)0x1;
      local_428.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)&DAT_3ff0000000000000;
      local_478 = (undefined **)0x4000000000000000;
      local_4e0.
      super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
      .m_data = (PointerType)&local_428;
      this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_4e0,
                           (Scalar *)&local_478);
      local_510[0] = false;
      local_510[1] = false;
      local_510[2] = false;
      local_510[3] = false;
      local_510[4] = false;
      local_510[5] = false;
      local_510[6] = true;
      local_510[7] = true;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                (this_00,(Scalar *)local_510);
      if ((&((local_4e0.
              super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
              .
              super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
             .m_xpr)->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).field_0x0 +
           local_4e0.
           super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
           .
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
           .m_rows.m_value != (undefined1 *)0x3) ||
         (local_4e0.
          super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
          ._16_8_ != 1)) {
        __function = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
        ;
        goto LAB_0012816b;
      }
      local_4e0.
      super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
      .m_rows.m_value = 0;
      local_4e0.
      super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
      ._16_8_ = 1;
      local_4e0.
      super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
      .m_xpr = (XprTypeNested)0x1;
      local_4e0.
      super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
      .m_data = (PointerType)local_498;
      if ((long)local_498._8_8_ < 1) {
LAB_00128088:
        local_4e0.
        super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
        .m_xpr = (XprTypeNested)0x1;
        local_4e0.
        super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
        ._16_8_ = 1;
        local_4e0.
        super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
        .m_rows.m_value = 0;
        __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                      "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      *(double *)local_498._0_8_ = 4.0;
      local_478 = (undefined **)0x4014000000000000;
      pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4e0,
                          (Scalar *)&local_478);
      local_510[0] = false;
      local_510[1] = false;
      local_510[2] = false;
      local_510[3] = false;
      local_510[4] = false;
      local_510[5] = false;
      local_510[6] = true;
      local_510[7] = true;
      pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar1,(Scalar *)local_510);
      local_528 = (char *)0x401c000000000000;
      pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar1,(Scalar *)&local_528);
      local_518 = 8.0;
      pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar1,&local_518);
      local_430 = 9.0;
      pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar1,&local_430);
      local_438 = 10.0;
      pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar1,&local_438);
      local_440 = 11.0;
      pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar1,&local_440);
      local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = 12.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (pCVar1,local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array + 2);
      if ((&((local_4e0.
              super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
              .
              super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
             .m_xpr)->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).field_0x0 +
           local_4e0.
           super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
           .
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
           .m_rows.m_value ==
           (undefined1 *)
           (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            local_4e0.
            super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
            .
            super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
            .m_data)->m_storage).m_data.array[1]) &&
         (local_4e0.
          super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
          ._16_8_ == 1)) {
        local_4e0.
        super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
        .m_rows.m_value = 0;
        local_4e0.
        super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
        ._16_8_ = 1;
        local_4e0.
        super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
        .m_xpr = (XprTypeNested)0x1;
        local_4e0.
        super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
        .
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
        .m_data = (PointerType)local_4a8;
        if ((long)local_4a8._8_8_ < 1) goto LAB_00128088;
        *(double *)local_4a8._0_8_ = 6.0;
        local_478 = (undefined **)0x401c000000000000;
        pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4e0,
                            (Scalar *)&local_478);
        local_510[0] = false;
        local_510[1] = false;
        local_510[2] = false;
        local_510[3] = false;
        local_510[4] = false;
        local_510[5] = false;
        local_510[6] = true;
        local_510[7] = true;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar1,(Scalar *)local_510);
        if ((&((local_4e0.
                super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                .
                super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
               .m_xpr)->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ).field_0x0 +
             local_4e0.
             super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
             .
             super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
             .m_rows.m_value ==
             (undefined1 *)
             (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
              local_4e0.
              super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
              .
              super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
              .m_data)->m_storage).m_data.array[1]) &&
           (local_4e0.
            super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
            .
            super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
            ._16_8_ == 1)) {
          local_4e0.
          super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
          .m_rows.m_value = 0;
          local_4e0.
          super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
          ._16_8_ = 1;
          local_4e0.
          super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .m_xpr = (XprTypeNested)0x1;
          local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = 13.0;
          local_478 = (undefined **)0x402c000000000000;
          local_4e0.
          super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
          .m_data = (PointerType)&local_458;
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                    ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_4e0,
                     (Scalar *)&local_478);
          if ((&((local_4e0.
                  super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                  .
                  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
                 .m_xpr)->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ).field_0x0 +
               local_4e0.
               super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
               .
               super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
               .m_rows.m_value == (undefined1 *)0x2) &&
             (local_4e0.
              super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
              .
              super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
              ._16_8_ == 1)) {
            local_1d0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
            ;
            local_1c8 = "";
            local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x221);
            local_398 = (double *)local_498._16_8_;
            local_390 = lStack_480;
            if (-1 < lStack_480 || (double *)local_498._16_8_ == (double *)0x0) {
              mnf::Manifold::getView<0>(&local_4e0,(Manifold *)local_380,(RefVec *)&local_398,0);
              local_518 = 1e-12;
              local_510[0] = Eigen::internal::
                             isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1,_1,_false>,_false>
                             ::run(&local_428,
                                   &local_4e0.
                                    super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                                   ,&local_518);
              local_510[8] = false;
              local_510[9] = false;
              local_510[10] = false;
              local_510[0xb] = false;
              local_510[0xc] = false;
              local_510[0xd] = false;
              local_510[0xe] = false;
              local_510[0xf] = false;
              sStack_500.pi_ = (sp_counted_base *)0x0;
              local_528 = "xR3.isApprox(S.getView<R>(x, 0))";
              local_520 = "";
              local_470 = 0;
              local_478 = &PTR__lazy_ostream_00142bd0;
              local_468 = &boost::unit_test::lazy_ostream::inst;
              local_460 = &local_528;
              local_1f0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
              ;
              local_1e8 = "";
              boost::test_tools::tt_detail::report_assertion();
              boost::detail::shared_count::~shared_count(&sStack_500);
              local_200 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
              ;
              local_1f8 = "";
              local_210 = &boost::unit_test::basic_cstring<char_const>::null;
              local_208 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x222);
              local_3b0 = (double *)local_498._16_8_;
              local_3a8 = lStack_480;
              if (-1 < lStack_480 || (double *)local_498._16_8_ == (double *)0x0) {
                mnf::Manifold::getView<0>(&local_4e0,(Manifold *)local_380,(RefVec *)&local_3b0,1);
                local_518 = 1e-12;
                local_510[0] = Eigen::internal::
                               isApprox_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1,_1,_false>,_false>
                               ::run((Matrix<double,__1,_1,_0,__1,_1> *)local_498,
                                     &local_4e0.
                                      super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                                     ,&local_518);
                local_510[8] = false;
                local_510[9] = false;
                local_510[10] = false;
                local_510[0xb] = false;
                local_510[0xc] = false;
                local_510[0xd] = false;
                local_510[0xe] = false;
                local_510[0xf] = false;
                sStack_500.pi_ = (sp_counted_base *)0x0;
                local_528 = "xSO3.isApprox(S.getView<R>(x, 1))";
                local_520 = "";
                local_470 = 0;
                local_478 = &PTR__lazy_ostream_00142bd0;
                local_468 = &boost::unit_test::lazy_ostream::inst;
                local_460 = &local_528;
                local_220 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
                ;
                local_218 = "";
                boost::test_tools::tt_detail::report_assertion();
                boost::detail::shared_count::~shared_count(&sStack_500);
                local_230 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
                ;
                local_228 = "";
                local_240 = &boost::unit_test::basic_cstring<char_const>::null;
                local_238 = &boost::unit_test::basic_cstring<char_const>::null;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x223);
                local_3c8 = (double *)local_498._16_8_;
                local_3c0 = lStack_480;
                if (-1 < lStack_480 || (double *)local_498._16_8_ == (double *)0x0) {
                  mnf::Manifold::getView<0>(&local_4e0,(Manifold *)local_380,(RefVec *)&local_3c8,2)
                  ;
                  local_518 = 1e-12;
                  local_510[0] = Eigen::internal::
                                 isApprox_selector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1,_1,_false>,_false>
                                 ::run((Matrix<double,_2,_1,_0,_2,_1> *)&local_458,
                                       &local_4e0.
                                        super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                                       ,&local_518);
                  local_510[8] = false;
                  local_510[9] = false;
                  local_510[10] = false;
                  local_510[0xb] = false;
                  local_510[0xc] = false;
                  local_510[0xd] = false;
                  local_510[0xe] = false;
                  local_510[0xf] = false;
                  sStack_500.pi_ = (sp_counted_base *)0x0;
                  local_528 = "xR2.isApprox(S.getView<R>(x, 2))";
                  local_520 = "";
                  local_470 = 0;
                  local_478 = &PTR__lazy_ostream_00142bd0;
                  local_468 = &boost::unit_test::lazy_ostream::inst;
                  local_460 = &local_528;
                  local_250 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
                  ;
                  local_248 = "";
                  boost::test_tools::tt_detail::report_assertion();
                  boost::detail::shared_count::~shared_count(&sStack_500);
                  local_260 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
                  ;
                  local_258 = "";
                  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x224
                            );
                  local_3e0 = (double *)
                              local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[0];
                  local_3d8 = local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[1];
                  if (-1 < (long)local_4f8.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1] ||
                      (double *)
                      local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] == (double *)0x0) {
                    mnf::Manifold::getView<1>
                              (&local_4e0,(Manifold *)local_380,(RefVec *)&local_3e0,0);
                    local_518 = 1e-12;
                    local_510[0] = Eigen::internal::
                                   isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1,_1,_false>,_false>
                                   ::run(&local_428,
                                         &local_4e0.
                                          super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                                         ,&local_518);
                    local_510[8] = false;
                    local_510[9] = false;
                    local_510[10] = false;
                    local_510[0xb] = false;
                    local_510[0xc] = false;
                    local_510[0xd] = false;
                    local_510[0xe] = false;
                    local_510[0xf] = false;
                    sStack_500.pi_ = (sp_counted_base *)0x0;
                    local_528 = "xR3.isApprox(S.getView<T>(xT, 0))";
                    local_520 = "";
                    local_470 = 0;
                    local_478 = &PTR__lazy_ostream_00142bd0;
                    local_468 = &boost::unit_test::lazy_ostream::inst;
                    local_460 = &local_528;
                    local_280 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
                    ;
                    local_278 = "";
                    boost::test_tools::tt_detail::report_assertion();
                    boost::detail::shared_count::~shared_count(&sStack_500);
                    local_290 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
                    ;
                    local_288 = "";
                    local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_290,
                               0x225);
                    local_3f8 = (double *)
                                local_4f8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0];
                    local_3f0 = local_4f8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[1];
                    if (-1 < (long)local_4f8.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[1] ||
                        (double *)
                        local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[0] == (double *)0x0) {
                      mnf::Manifold::getView<1>
                                (&local_4e0,(Manifold *)local_380,(RefVec *)&local_3f8,1);
                      local_518 = 1e-12;
                      local_510[0] = Eigen::internal::
                                     isApprox_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1,_1,_false>,_false>
                                     ::run((Matrix<double,__1,_1,_0,__1,_1> *)local_4a8,
                                           &local_4e0.
                                            super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                                           ,&local_518);
                      local_510[8] = false;
                      local_510[9] = false;
                      local_510[10] = false;
                      local_510[0xb] = false;
                      local_510[0xc] = false;
                      local_510[0xd] = false;
                      local_510[0xe] = false;
                      local_510[0xf] = false;
                      sStack_500.pi_ = (sp_counted_base *)0x0;
                      local_528 = "xSO3T.isApprox(S.getView<T>(xT, 1))";
                      local_520 = "";
                      local_470 = 0;
                      local_478 = &PTR__lazy_ostream_00142bd0;
                      local_468 = &boost::unit_test::lazy_ostream::inst;
                      local_460 = &local_528;
                      local_2b0 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
                      ;
                      local_2a8 = "";
                      boost::test_tools::tt_detail::report_assertion();
                      boost::detail::shared_count::~shared_count(&sStack_500);
                      local_2c0 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
                      ;
                      local_2b8 = "";
                      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,
                                 0x226);
                      local_410 = (double *)
                                  local_4f8.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[0];
                      local_408 = local_4f8.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[1];
                      if (-1 < (long)local_4f8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array[1] ||
                          (double *)
                          local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0] == (double *)0x0) {
                        mnf::Manifold::getView<1>
                                  (&local_4e0,(Manifold *)local_380,(RefVec *)&local_410,2);
                        local_518 = 1e-12;
                        local_510[0] = Eigen::internal::
                                       isApprox_selector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1,_1,_false>,_false>
                                       ::run((Matrix<double,_2,_1,_0,_2,_1> *)&local_458,
                                             &local_4e0.
                                              super_Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                                             ,&local_518);
                        local_510[8] = false;
                        local_510[9] = false;
                        local_510[10] = false;
                        local_510[0xb] = false;
                        local_510[0xc] = false;
                        local_510[0xd] = false;
                        local_510[0xe] = false;
                        local_510[0xf] = false;
                        sStack_500.pi_ = (sp_counted_base *)0x0;
                        local_528 = "xR2.isApprox(S.getView<T>(xT, 2))";
                        local_520 = "";
                        local_470 = 0;
                        local_478 = &PTR__lazy_ostream_00142bd0;
                        local_468 = &boost::unit_test::lazy_ostream::inst;
                        local_460 = &local_528;
                        local_2e0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
                        ;
                        local_2d8 = "";
                        boost::test_tools::tt_detail::report_assertion();
                        boost::detail::shared_count::~shared_count(&sStack_500);
                        free((void *)local_4a8._0_8_);
                        free((void *)local_498._0_8_);
                        free((void *)local_4f8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array[0]);
                        free((void *)local_498._16_8_);
                        local_380[0] = free;
                        if (local_2f8 != (void *)0x0) {
                          operator_delete(local_2f8);
                        }
                        if (local_310 != (void *)0x0) {
                          operator_delete(local_310);
                        }
                        std::
                        vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                        ::~vector(local_328);
                        mnf::Manifold::~Manifold((Manifold *)local_380);
                        local_1c0._0_8_ = &PTR__SO3_00142718;
                        mnf::ReusableTemporaryMap::~ReusableTemporaryMap
                                  ((ReusableTemporaryMap *)((long)&local_1c0 + 0x58));
                        mnf::Manifold::~Manifold(&local_1c0.super_Manifold);
                        local_120[0] = std::terminate;
                        free(local_b8);
                        free(local_c8);
                        mnf::Manifold::~Manifold((Manifold *)local_120);
                        local_a8[0] = std::terminate;
                        free(local_40);
                        free(local_50);
                        mnf::Manifold::~Manifold((Manifold *)local_a8);
                        return;
                      }
                    }
                  }
                }
              }
            }
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                         );
          }
          __function = 
          "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 1>]"
          ;
          goto LAB_0012816b;
        }
      }
    }
  }
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_0012816b:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

BOOST_AUTO_TEST_CASE(CardProdGetView)
{
  RealSpace R2(2);
  RealSpace R3(3);
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct S(R3, RotSpace);
  S.multiply(R2);
  Eigen::VectorXd x(14);
  x << 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14;
  Eigen::VectorXd xT(8);
  xT << 1, 2, 3, 6, 7, 8, 13, 14;
  Eigen::Vector3d xR3;
  Eigen::VectorXd xSO3(9);
  Eigen::VectorXd xSO3T(3);
  Eigen::Vector2d xR2;
  xR3 << 1, 2, 3;
  xSO3 << 4, 5, 6, 7, 8, 9, 10, 11, 12;
  xSO3T << 6, 7, 8;
  xR2 << 13, 14;

  BOOST_CHECK(xR3.isApprox(S.getView<R>(x, 0)));
  BOOST_CHECK(xSO3.isApprox(S.getView<R>(x, 1)));
  BOOST_CHECK(xR2.isApprox(S.getView<R>(x, 2)));
  BOOST_CHECK(xR3.isApprox(S.getView<T>(xT, 0)));
  BOOST_CHECK(xSO3T.isApprox(S.getView<T>(xT, 1)));
  BOOST_CHECK(xR2.isApprox(S.getView<T>(xT, 2)));
}